

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O2

void Llb_ManTestCuts(Aig_Man_t *p)

{
  uint uVar1;
  Aig_Obj_t *pPivot;
  uint i;
  
  Aig_ManFanoutStart(p);
  i = 0;
  do {
    if (p->vObjs->nSize <= (int)i) {
      Aig_ManFanoutStop(p);
      return;
    }
    pPivot = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,i);
    if (((pPivot != (Aig_Obj_t *)0x0) && (0x7f < *(uint *)&pPivot->field_0x18)) &&
       (0xfffffffd < (*(uint *)&pPivot->field_0x18 & 7) - 7)) {
      uVar1 = Llb_ManTracePaths(p,pPivot);
      if (((ulong)pPivot & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x143,"int Aig_ObjLevel(Aig_Obj_t *)");
      }
      printf("Obj =%5d.  Lev =%3d.  Fanout =%5d.  Count = %3d.\n",(ulong)i,
             (ulong)((uint)(*(ulong *)&pPivot->field_0x18 >> 0x20) & 0xffffff),
             *(ulong *)&pPivot->field_0x18 >> 6 & 0x3ffffff,(ulong)uVar1);
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Llb_ManTestCuts( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Count;
    Aig_ManFanoutStart( p );
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( Aig_ObjRefs(pObj) <= 1 )
            continue;
        Count = Llb_ManTracePaths( p, pObj );
        printf( "Obj =%5d.  Lev =%3d.  Fanout =%5d.  Count = %3d.\n", 
            i, Aig_ObjLevel(pObj), Aig_ObjRefs(pObj), Count );
    }
    Aig_ManFanoutStop( p );
}